

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall
chrono::ChSystemDescriptor::BuildBiVector(ChSystemDescriptor *this,ChVectorDynamic<> *Bvector)

{
  long lVar1;
  pointer ppCVar2;
  double *pdVar3;
  ChConstraint *pCVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = (*this->_vptr_ChSystemDescriptor[8])();
  this->n_c = iVar5;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar5);
  lVar1 = (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (lVar1 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar1 != 0) {
    memset((Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar1 * 8);
  }
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2;
  if (lVar6 != 0) {
    pdVar3 = (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar6 = lVar6 >> 3;
    lVar7 = 0;
    do {
      pCVar4 = ppCVar2[lVar7];
      if (pCVar4->active == true) {
        lVar8 = (long)pCVar4->offset;
        if ((lVar8 < 0) || (lVar1 <= lVar8)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pdVar3[lVar8] = pCVar4->b_i;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return this->n_c;
}

Assistant:

int ChSystemDescriptor::BuildBiVector(ChVectorDynamic<>& Bvector) {
    n_c = CountActiveConstraints();
    Bvector.setZero(n_c);

    auto vc_size = vconstraints.size();

    // Fill the 'b' vector
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            Bvector(vconstraints[ic]->GetOffset()) = vconstraints[ic]->Get_b_i();
        }
    }

    return n_c;
}